

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

bool __thiscall
QFilePrivate::openExternalFile
          (QFilePrivate *this,OpenMode flags,FILE *fh,FileHandleFlags handleFlags)

{
  long lVar1;
  QAbstractFileEngine *pQVar2;
  int iVar3;
  pointer __p;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<QFSFileEngine>();
  pQVar2 = (this->super_QFileDevicePrivate).fileEngine._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  (this->super_QFileDevicePrivate).fileEngine._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (QAbstractFileEngine *)&DAT_aaaaaaaaaaaaaaaa;
  if (pQVar2 != (QAbstractFileEngine *)0x0) {
    (*pQVar2->_vptr_QAbstractFileEngine[1])();
  }
  iVar3 = QFSFileEngine::open((QFSFileEngine *)&DAT_aaaaaaaaaaaaaaaa,
                              flags.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,(int)fh,
                              (ulong)(uint)handleFlags.
                                           super_QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>
                                           .super_QFlagsStorage<QFileDevice::FileHandleFlag>.i);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return SUB41(iVar3,0);
}

Assistant:

bool
QFilePrivate::openExternalFile(QIODevice::OpenMode flags, FILE *fh, QFile::FileHandleFlags handleFlags)
{
#ifdef QT_NO_FSFILEENGINE
    Q_UNUSED(flags);
    Q_UNUSED(fh);
    return false;
#else
    auto fs = std::make_unique<QFSFileEngine>();
    auto fe = fs.get();
    fileEngine = std::move(fs);
    return fe->open(flags, fh, handleFlags);
#endif
}